

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O2

string * __thiscall
AliHttpRequest::GetPath_abi_cxx11_
          (string *__return_storage_ptr__,AliHttpRequest *this,bool with_query)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->path_);
  if (__return_storage_ptr__->_M_string_length == 0) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  if ((this->is_tls == false) && ((this->proxy_host_)._M_string_length != 0)) {
    std::operator+(&local_60,"http://",&this->host_);
    std::operator+(&local_40,&local_60,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  if (with_query) {
    if ((this->query_)._M_string_length != 0) {
      psVar1 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append(psVar1);
    }
    if ((this->flagment_)._M_string_length != 0) {
      psVar1 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append(psVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AliHttpRequest::GetPath(bool with_query) {
  std::string path = this->path_;

  if(path.empty()) {
    path = "/";
  }

  // support http proxy only
  if(!this->is_tls && !this->proxy_host_.empty()) {
    path = "http://" + this->host_ + path;
  }
  
  if(with_query) {
    if(!this->query_.empty()) {
      path.append("?").append(query_);
    }
    if(!this->flagment_.empty()) {
      path.append("#").append(flagment_);
    }
  }

  return path;
}